

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void HFilter16_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar3 [16];
  byte bVar18;
  undefined1 auVar19 [16];
  byte bVar20;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  undefined1 auVar21 [16];
  byte bVar36;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i q0;
  byte local_e8;
  byte bStack_e7;
  byte bStack_e6;
  byte bStack_e5;
  byte bStack_e4;
  byte bStack_e3;
  byte bStack_e2;
  byte bStack_e1;
  byte bStack_e0;
  byte bStack_df;
  byte bStack_de;
  byte bStack_dd;
  byte bStack_dc;
  byte bStack_db;
  byte bStack_da;
  byte bStack_d9;
  __m128i local_c8;
  __m128i local_b8;
  __m128i local_a8;
  __m128i local_98;
  __m128i local_88;
  __m128i local_78;
  __m128i local_68;
  __m128i local_58;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  Load16x4_SSE2(p + -4,p + (long)(stride * 8) + -4,stride,&local_68,&local_78,&local_88,&local_98);
  auVar19 = psubusb((undefined1  [16])local_88,(undefined1  [16])local_98);
  auVar3 = psubusb((undefined1  [16])local_98,(undefined1  [16])local_88);
  auVar3 = auVar3 | auVar19;
  auVar19 = psubusb((undefined1  [16])local_78,(undefined1  [16])local_68);
  auVar21 = psubusb((undefined1  [16])local_68,(undefined1  [16])local_78);
  auVar21 = auVar21 | auVar19;
  bVar1 = auVar3[0];
  bVar2 = auVar21[0];
  bVar20 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[1];
  bVar2 = auVar21[1];
  bVar22 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[2];
  bVar2 = auVar21[2];
  bVar23 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[3];
  bVar2 = auVar21[3];
  bVar24 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[4];
  bVar2 = auVar21[4];
  bVar25 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[5];
  bVar2 = auVar21[5];
  bVar26 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[6];
  bVar2 = auVar21[6];
  bVar27 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[7];
  bVar2 = auVar21[7];
  bVar28 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[8];
  bVar2 = auVar21[8];
  bVar29 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[9];
  bVar2 = auVar21[9];
  bVar30 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[10];
  bVar2 = auVar21[10];
  bVar31 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xb];
  bVar2 = auVar21[0xb];
  bVar32 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xc];
  bVar2 = auVar21[0xc];
  bVar33 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xd];
  bVar2 = auVar21[0xd];
  bVar34 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xe];
  bVar2 = auVar21[0xe];
  bVar4 = auVar21[0xf];
  bVar35 = (bVar2 < bVar1) * bVar1 | (bVar2 >= bVar1) * bVar2;
  bVar1 = auVar3[0xf];
  bVar36 = (bVar4 < bVar1) * bVar1 | (bVar4 >= bVar1) * bVar4;
  auVar3 = psubusb((undefined1  [16])local_88,(undefined1  [16])local_78);
  auVar21 = psubusb((undefined1  [16])local_78,(undefined1  [16])local_88);
  auVar21 = auVar21 | auVar3;
  Load16x4_SSE2(p,p + stride * 8,stride,&local_58,&local_a8,&local_b8,&local_c8);
  auVar19 = psubusb((undefined1  [16])local_a8,(undefined1  [16])local_58);
  auVar3 = psubusb((undefined1  [16])local_58,(undefined1  [16])local_a8);
  auVar3 = auVar3 | auVar19;
  local_e8 = auVar21[0];
  bStack_e7 = auVar21[1];
  bStack_e6 = auVar21[2];
  bStack_e5 = auVar21[3];
  bStack_e4 = auVar21[4];
  bStack_e3 = auVar21[5];
  bStack_e2 = auVar21[6];
  bStack_e1 = auVar21[7];
  bStack_e0 = auVar21[8];
  bStack_df = auVar21[9];
  bStack_de = auVar21[10];
  bStack_dd = auVar21[0xb];
  bStack_dc = auVar21[0xc];
  bStack_db = auVar21[0xd];
  bStack_da = auVar21[0xe];
  bStack_d9 = auVar21[0xf];
  bVar1 = auVar3[0];
  bVar1 = (bVar1 < local_e8) * local_e8 | (bVar1 >= local_e8) * bVar1;
  bVar2 = auVar3[1];
  bVar4 = (bVar2 < bStack_e7) * bStack_e7 | (bVar2 >= bStack_e7) * bVar2;
  bVar2 = auVar3[2];
  bVar5 = (bVar2 < bStack_e6) * bStack_e6 | (bVar2 >= bStack_e6) * bVar2;
  bVar2 = auVar3[3];
  bVar6 = (bVar2 < bStack_e5) * bStack_e5 | (bVar2 >= bStack_e5) * bVar2;
  bVar2 = auVar3[4];
  bVar7 = (bVar2 < bStack_e4) * bStack_e4 | (bVar2 >= bStack_e4) * bVar2;
  bVar2 = auVar3[5];
  bVar8 = (bVar2 < bStack_e3) * bStack_e3 | (bVar2 >= bStack_e3) * bVar2;
  bVar2 = auVar3[6];
  bVar9 = (bVar2 < bStack_e2) * bStack_e2 | (bVar2 >= bStack_e2) * bVar2;
  bVar2 = auVar3[7];
  bVar10 = (bVar2 < bStack_e1) * bStack_e1 | (bVar2 >= bStack_e1) * bVar2;
  bVar2 = auVar3[8];
  bVar11 = (bVar2 < bStack_e0) * bStack_e0 | (bVar2 >= bStack_e0) * bVar2;
  bVar2 = auVar3[9];
  bVar12 = (bVar2 < bStack_df) * bStack_df | (bVar2 >= bStack_df) * bVar2;
  bVar2 = auVar3[10];
  bVar13 = (bVar2 < bStack_de) * bStack_de | (bVar2 >= bStack_de) * bVar2;
  bVar2 = auVar3[0xb];
  bVar14 = (bVar2 < bStack_dd) * bStack_dd | (bVar2 >= bStack_dd) * bVar2;
  bVar2 = auVar3[0xc];
  bVar15 = (bVar2 < bStack_dc) * bStack_dc | (bVar2 >= bStack_dc) * bVar2;
  bVar2 = auVar3[0xd];
  bVar16 = (bVar2 < bStack_db) * bStack_db | (bVar2 >= bStack_db) * bVar2;
  bVar2 = auVar3[0xe];
  bVar18 = auVar3[0xf];
  bVar17 = (bVar2 < bStack_da) * bStack_da | (bVar2 >= bStack_da) * bVar2;
  bVar18 = (bVar18 < bStack_d9) * bStack_d9 | (bVar18 >= bStack_d9) * bVar18;
  bVar2 = (bVar1 < bVar20) * bVar20 | (bVar1 >= bVar20) * bVar1;
  bVar4 = (bVar4 < bVar22) * bVar22 | (bVar4 >= bVar22) * bVar4;
  bVar5 = (bVar5 < bVar23) * bVar23 | (bVar5 >= bVar23) * bVar5;
  bVar6 = (bVar6 < bVar24) * bVar24 | (bVar6 >= bVar24) * bVar6;
  bVar7 = (bVar7 < bVar25) * bVar25 | (bVar7 >= bVar25) * bVar7;
  bVar8 = (bVar8 < bVar26) * bVar26 | (bVar8 >= bVar26) * bVar8;
  bVar9 = (bVar9 < bVar27) * bVar27 | (bVar9 >= bVar27) * bVar9;
  bVar10 = (bVar10 < bVar28) * bVar28 | (bVar10 >= bVar28) * bVar10;
  bVar11 = (bVar11 < bVar29) * bVar29 | (bVar11 >= bVar29) * bVar11;
  bVar12 = (bVar12 < bVar30) * bVar30 | (bVar12 >= bVar30) * bVar12;
  bVar13 = (bVar13 < bVar31) * bVar31 | (bVar13 >= bVar31) * bVar13;
  bVar14 = (bVar14 < bVar32) * bVar32 | (bVar14 >= bVar32) * bVar14;
  bVar15 = (bVar15 < bVar33) * bVar33 | (bVar15 >= bVar33) * bVar15;
  bVar16 = (bVar16 < bVar34) * bVar34 | (bVar16 >= bVar34) * bVar16;
  bVar17 = (bVar17 < bVar35) * bVar35 | (bVar17 >= bVar35) * bVar17;
  bVar18 = (bVar18 < bVar36) * bVar36 | (bVar18 >= bVar36) * bVar18;
  auVar3 = psubusb((undefined1  [16])local_b8,(undefined1  [16])local_c8);
  auVar19 = psubusb((undefined1  [16])local_c8,(undefined1  [16])local_b8);
  auVar19 = auVar19 | auVar3;
  auVar21 = psubusb((undefined1  [16])local_a8,(undefined1  [16])local_b8);
  auVar3 = psubusb((undefined1  [16])local_b8,(undefined1  [16])local_a8);
  auVar3 = auVar3 | auVar21;
  bVar1 = auVar19[0];
  bVar20 = auVar3[0];
  bVar20 = (bVar20 < bVar1) * bVar1 | (bVar20 >= bVar1) * bVar20;
  bVar1 = auVar19[1];
  bVar22 = auVar3[1];
  bVar22 = (bVar22 < bVar1) * bVar1 | (bVar22 >= bVar1) * bVar22;
  bVar1 = auVar19[2];
  bVar23 = auVar3[2];
  bVar23 = (bVar23 < bVar1) * bVar1 | (bVar23 >= bVar1) * bVar23;
  bVar1 = auVar19[3];
  bVar24 = auVar3[3];
  bVar24 = (bVar24 < bVar1) * bVar1 | (bVar24 >= bVar1) * bVar24;
  bVar1 = auVar19[4];
  bVar25 = auVar3[4];
  bVar25 = (bVar25 < bVar1) * bVar1 | (bVar25 >= bVar1) * bVar25;
  bVar1 = auVar19[5];
  bVar26 = auVar3[5];
  bVar26 = (bVar26 < bVar1) * bVar1 | (bVar26 >= bVar1) * bVar26;
  bVar1 = auVar19[6];
  bVar27 = auVar3[6];
  bVar27 = (bVar27 < bVar1) * bVar1 | (bVar27 >= bVar1) * bVar27;
  bVar1 = auVar19[7];
  bVar28 = auVar3[7];
  bVar28 = (bVar28 < bVar1) * bVar1 | (bVar28 >= bVar1) * bVar28;
  bVar1 = auVar19[8];
  bVar29 = auVar3[8];
  bVar29 = (bVar29 < bVar1) * bVar1 | (bVar29 >= bVar1) * bVar29;
  bVar1 = auVar19[9];
  bVar30 = auVar3[9];
  bVar30 = (bVar30 < bVar1) * bVar1 | (bVar30 >= bVar1) * bVar30;
  bVar1 = auVar19[10];
  bVar31 = auVar3[10];
  bVar31 = (bVar31 < bVar1) * bVar1 | (bVar31 >= bVar1) * bVar31;
  bVar1 = auVar19[0xb];
  bVar32 = auVar3[0xb];
  bVar32 = (bVar32 < bVar1) * bVar1 | (bVar32 >= bVar1) * bVar32;
  bVar1 = auVar19[0xc];
  bVar33 = auVar3[0xc];
  bVar33 = (bVar33 < bVar1) * bVar1 | (bVar33 >= bVar1) * bVar33;
  bVar1 = auVar19[0xd];
  bVar34 = auVar3[0xd];
  bVar34 = (bVar34 < bVar1) * bVar1 | (bVar34 >= bVar1) * bVar34;
  bVar1 = auVar19[0xe];
  bVar35 = auVar3[0xe];
  bVar36 = auVar3[0xf];
  bVar35 = (bVar35 < bVar1) * bVar1 | (bVar35 >= bVar1) * bVar35;
  bVar1 = auVar19[0xf];
  bVar1 = (bVar36 < bVar1) * bVar1 | (bVar36 >= bVar1) * bVar36;
  local_48 = (bVar20 < bVar2) * bVar2 | (bVar20 >= bVar2) * bVar20;
  bStack_47 = (bVar22 < bVar4) * bVar4 | (bVar22 >= bVar4) * bVar22;
  bStack_46 = (bVar23 < bVar5) * bVar5 | (bVar23 >= bVar5) * bVar23;
  bStack_45 = (bVar24 < bVar6) * bVar6 | (bVar24 >= bVar6) * bVar24;
  bStack_44 = (bVar25 < bVar7) * bVar7 | (bVar25 >= bVar7) * bVar25;
  bStack_43 = (bVar26 < bVar8) * bVar8 | (bVar26 >= bVar8) * bVar26;
  bStack_42 = (bVar27 < bVar9) * bVar9 | (bVar27 >= bVar9) * bVar27;
  bStack_41 = (bVar28 < bVar10) * bVar10 | (bVar28 >= bVar10) * bVar28;
  bStack_40 = (bVar29 < bVar11) * bVar11 | (bVar29 >= bVar11) * bVar29;
  bStack_3f = (bVar30 < bVar12) * bVar12 | (bVar30 >= bVar12) * bVar30;
  bStack_3e = (bVar31 < bVar13) * bVar13 | (bVar31 >= bVar13) * bVar31;
  bStack_3d = (bVar32 < bVar14) * bVar14 | (bVar32 >= bVar14) * bVar32;
  bStack_3c = (bVar33 < bVar15) * bVar15 | (bVar33 >= bVar15) * bVar33;
  bStack_3b = (bVar34 < bVar16) * bVar16 | (bVar34 >= bVar16) * bVar34;
  bStack_3a = (bVar35 < bVar17) * bVar17 | (bVar35 >= bVar17) * bVar35;
  bStack_39 = (bVar1 < bVar18) * bVar18 | (bVar1 >= bVar18) * bVar1;
  ComplexMask_SSE2(&local_88,&local_98,&local_58,&local_a8,thresh,ithresh,(__m128i *)&local_48);
  DoFilter6_SSE2(&local_78,&local_88,&local_98,&local_58,&local_a8,&local_b8,(__m128i *)&local_48,
                 hev_thresh);
  Store16x4_SSE2(&local_68,&local_78,&local_88,&local_98,p + -4,p + (long)(stride * 8) + -4,stride);
  Store16x4_SSE2(&local_58,&local_a8,&local_b8,&local_c8,p,p + stride * 8,stride);
  return;
}

Assistant:

static void HFilter16_SSE2(uint8_t* p, int stride,
                           int thresh, int ithresh, int hev_thresh) {
  __m128i mask;
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;

  uint8_t* const b = p - 4;
  Load16x4_SSE2(b, b + 8 * stride, stride, &p3, &p2, &p1, &p0);
  MAX_DIFF1(p3, p2, p1, p0, mask);

  Load16x4_SSE2(p, p + 8 * stride, stride, &q0, &q1, &q2, &q3);
  MAX_DIFF2(q3, q2, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter6_SSE2(&p2, &p1, &p0, &q0, &q1, &q2, &mask, hev_thresh);

  Store16x4_SSE2(&p3, &p2, &p1, &p0, b, b + 8 * stride, stride);
  Store16x4_SSE2(&q0, &q1, &q2, &q3, p, p + 8 * stride, stride);
}